

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

Duration absl::lts_20250127::anon_unknown_1::ScaleDouble<std::multiplies>(Duration d,double r)

{
  Duration DVar1;
  bool bVar2;
  uint32_t uVar3;
  int64_t iVar4;
  uint32_t in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  HiRep this;
  double dVar5;
  Duration DVar6;
  Duration d_00;
  Duration d_01;
  Duration d_02;
  HiRep local_128;
  uint32_t local_120;
  int64_t local_e0;
  int64_t hi64;
  Duration ans;
  int64_t lo64;
  double lo_frac;
  double lo_int;
  double hi_frac;
  double hi_int;
  uint local_98;
  HiRep local_90;
  uint local_88;
  double local_80;
  double local_78;
  double lo_doub;
  uint local_68;
  HiRep local_60;
  uint local_58;
  double local_50;
  double local_48;
  double hi_doub;
  double dStack_38;
  multiplies<double> op;
  double r_local;
  Duration d_local;
  uint32_t local_c;
  
  DVar6.rep_hi_.lo_ = d.rep_lo_;
  this = d.rep_hi_;
  DVar6.rep_hi_.hi_ = 0;
  DVar6.rep_lo_ = in_EDX;
  lo_doub = (double)this;
  local_68 = DVar6.rep_hi_.lo_;
  local_60 = this;
  local_58 = DVar6.rep_hi_.lo_;
  dStack_38 = r;
  iVar4 = time_internal::GetRepHi((time_internal *)this,DVar6);
  local_50 = (double)iVar4;
  local_48 = std::multiplies<double>::operator()
                       ((multiplies<double> *)((long)&hi_doub + 7),&local_50,
                        &stack0xffffffffffffffc8);
  d_00.rep_hi_.hi_ = 0;
  d_00.rep_hi_.lo_ = DVar6.rep_hi_.lo_;
  d_00.rep_lo_ = (uint32_t)extraout_RDX;
  hi_int = (double)this;
  local_98 = DVar6.rep_hi_.lo_;
  local_90 = this;
  local_88 = DVar6.rep_hi_.lo_;
  uVar3 = time_internal::GetRepLo((time_internal *)this,d_00);
  local_80 = (double)uVar3;
  local_78 = std::multiplies<double>::operator()
                       ((multiplies<double> *)((long)&hi_doub + 7),&local_80,
                        &stack0xffffffffffffffc8);
  hi_frac = 0.0;
  lo_int = modf(local_48,&hi_frac);
  local_78 = lo_int + local_78 / 4000000000.0;
  lo_frac = 0.0;
  dVar5 = modf(local_78,&lo_frac);
  dVar5 = round(dVar5 * 4000000000.0);
  ans._4_8_ = (BADTYPE)dVar5;
  Duration::Duration((Duration *)((long)&hi64 + 4));
  bVar2 = SafeAddRepHi(hi_frac,lo_frac,(Duration *)((long)&hi64 + 4));
  if (bVar2) {
    d_01.rep_hi_.hi_ = 0;
    d_01.rep_hi_.lo_ = ans.rep_hi_.lo_;
    d_01.rep_lo_ = (uint32_t)extraout_RDX_00;
    local_e0 = time_internal::GetRepHi(stack0xffffffffffffff2c,d_01);
    bVar2 = SafeAddRepHi((double)local_e0,(double)((long)ans._4_8_ / 4000000000),
                         (Duration *)((long)&hi64 + 4));
    if (bVar2) {
      d_02.rep_hi_.hi_ = 0;
      d_02.rep_hi_.lo_ = ans.rep_hi_.lo_;
      d_02.rep_lo_ = (uint32_t)extraout_RDX_01;
      local_e0 = time_internal::GetRepHi(stack0xffffffffffffff2c,d_02);
      ans._4_8_ = (long)ans._4_8_ % 4000000000;
      NormalizeTicks(&local_e0,(int64_t *)&ans.rep_hi_.hi_);
      DVar6 = time_internal::MakeDuration(local_e0,ans._4_8_);
      local_128 = DVar6.rep_hi_;
      d_local.rep_hi_.hi_ = local_128.lo_;
      d_local.rep_lo_ = local_128.hi_;
      local_120 = DVar6.rep_lo_;
      local_c = local_120;
    }
    else {
      d_local._4_8_ = stack0xffffffffffffff2c;
      local_c = ans.rep_hi_.lo_;
    }
  }
  else {
    d_local._4_8_ = stack0xffffffffffffff2c;
    local_c = ans.rep_hi_.lo_;
  }
  DVar1.rep_lo_ = local_c;
  DVar1.rep_hi_.lo_ = d_local.rep_hi_.hi_;
  DVar1.rep_hi_.hi_ = d_local.rep_lo_;
  return DVar1;
}

Assistant:

inline Duration ScaleDouble(Duration d, double r) {
  Operation<double> op;
  double hi_doub = op(time_internal::GetRepHi(d), r);
  double lo_doub = op(time_internal::GetRepLo(d), r);

  double hi_int = 0;
  double hi_frac = std::modf(hi_doub, &hi_int);

  // Moves hi's fractional bits to lo.
  lo_doub /= kTicksPerSecond;
  lo_doub += hi_frac;

  double lo_int = 0;
  double lo_frac = std::modf(lo_doub, &lo_int);

  // Rolls lo into hi if necessary.
  int64_t lo64 = std::round(lo_frac * kTicksPerSecond);

  Duration ans;
  if (!SafeAddRepHi(hi_int, lo_int, &ans)) return ans;
  int64_t hi64 = time_internal::GetRepHi(ans);
  if (!SafeAddRepHi(hi64, lo64 / kTicksPerSecond, &ans)) return ans;
  hi64 = time_internal::GetRepHi(ans);
  lo64 %= kTicksPerSecond;
  NormalizeTicks(&hi64, &lo64);
  return time_internal::MakeDuration(hi64, lo64);
}